

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O3

uint32_t WriteBinaryCamera(aiCamera *cam)

{
  uint uVar1;
  long lVar2;
  uint32_t n;
  undefined4 local_1c;
  
  local_1c = 0x1234;
  fwrite(&local_1c,4,1,(FILE *)out);
  fwrite(&local_1c,4,1,(FILE *)out);
  lVar2 = ftell((FILE *)out);
  uVar1 = (cam->mName).length;
  fwrite(cam,4,1,(FILE *)out);
  fwrite((cam->mName).data,(ulong)uVar1,1,(FILE *)out);
  fwrite(&cam->mPosition,4,1,(FILE *)out);
  fwrite(&(cam->mPosition).y,4,1,(FILE *)out);
  fwrite(&(cam->mPosition).z,4,1,(FILE *)out);
  fwrite(&cam->mLookAt,4,1,(FILE *)out);
  fwrite(&(cam->mLookAt).y,4,1,(FILE *)out);
  fwrite(&(cam->mLookAt).z,4,1,(FILE *)out);
  fwrite(&cam->mUp,4,1,(FILE *)out);
  fwrite(&(cam->mUp).y,4,1,(FILE *)out);
  fwrite(&(cam->mUp).z,4,1,(FILE *)out);
  fwrite(&cam->mHorizontalFOV,4,1,(FILE *)out);
  fwrite(&cam->mClipPlaneNear,4,1,(FILE *)out);
  fwrite(&cam->mClipPlaneFar,4,1,(FILE *)out);
  fwrite(&cam->mAspect,4,1,(FILE *)out);
  n = uVar1 + 0x38;
  ChangeInteger((int)lVar2 - 4,n);
  return n;
}

Assistant:

uint32_t WriteBinaryCamera(const aiCamera* cam)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AICAMERA);

	len += Write<aiString>(cam->mName);
	len += Write<aiVector3D>(cam->mPosition);
	len += Write<aiVector3D>(cam->mLookAt);
	len += Write<aiVector3D>(cam->mUp);
	len += Write<float>(cam->mHorizontalFOV);
	len += Write<float>(cam->mClipPlaneNear);
	len += Write<float>(cam->mClipPlaneFar);
	len += Write<float>(cam->mAspect);

	ChangeInteger(old,len);
	return len;
}